

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O0

Vat * __thiscall
capnp::_::anon_unknown_0::TestContext::initVat<capnproto_test::capnp::test::TestInterface::Client>
          (TestContext *this,StringPtr name,Client *bootstrap)

{
  StringPtr key;
  TestVat *params;
  Client *params_1;
  Entry *pEVar1;
  RefOrVoid<capnp::_::(anonymous_namespace)::TestContext::Vat> pVVar2;
  undefined1 local_48 [40];
  Client *bootstrap_local;
  TestContext *this_local;
  StringPtr name_local;
  
  local_48._24_8_ = name.content.size_;
  local_48._16_8_ = name.content.ptr;
  local_48._32_8_ = bootstrap;
  bootstrap_local = (Client *)this;
  this_local = (TestContext *)local_48._16_8_;
  name_local.content.ptr = (char *)local_48._24_8_;
  params = TestNetwork::add(&this->network,name);
  params_1 = kj::mv<capnproto_test::capnp::test::TestInterface::Client>(bootstrap);
  kj::
  heap<capnp::_::(anonymous_namespace)::TestContext::Vat,capnp::_::(anonymous_namespace)::TestVat&,capnproto_test::capnp::test::TestInterface::Client>
            ((kj *)local_48,params,params_1);
  key.content.size_ = local_48._24_8_;
  key.content.ptr = (char *)local_48._16_8_;
  pEVar1 = kj::
           HashMap<kj::StringPtr,_kj::Own<capnp::_::(anonymous_namespace)::TestContext::Vat,_std::nullptr_t>_>
           ::insert(&this->vats,key,
                    (Own<capnp::_::(anonymous_namespace)::TestContext::Vat,_std::nullptr_t> *)
                    local_48);
  pVVar2 = kj::Own<capnp::_::(anonymous_namespace)::TestContext::Vat,_std::nullptr_t>::operator*
                     (&pEVar1->value);
  kj::Own<capnp::_::(anonymous_namespace)::TestContext::Vat,_std::nullptr_t>::~Own
            ((Own<capnp::_::(anonymous_namespace)::TestContext::Vat,_std::nullptr_t> *)local_48);
  return pVVar2;
}

Assistant:

Vat& initVat(kj::StringPtr name, T bootstrap) {
    // Create a vat with the given name and bootstrap capability.
    return *vats.insert(name, kj::heap<Vat>(network.add(name), kj::mv(bootstrap))).value;
  }